

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageDither(Image *image,int rBpp,int gBpp,int bBpp,int aBpp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  Image image_00;
  int iVar6;
  Color *__ptr;
  void *pvVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  uchar uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  float fVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined4 in_stack_ffffffffffffff80;
  int iVar25;
  byte bVar26;
  char cVar27;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  
  if (((image->data == (void *)0x0) || (image->width == 0)) || (image->height == 0)) {
    return;
  }
  if (10 < image->format) {
    TraceLog(4,"IMAGE: Compressed data formats can not be dithered");
    return;
  }
  iVar6 = aBpp + bBpp;
  uVar10 = gBpp + rBpp + iVar6;
  if (0x10 < (int)uVar10) {
    TraceLog(4,"IMAGE: Unsupported dithering bpps (%ibpp), only 16bpp or lower modes supported",
             (ulong)uVar10);
    return;
  }
  uVar24._0_4_ = image->mipmaps;
  uVar24._4_4_ = image->format;
  uVar22 = (undefined4)((ulong)image->data >> 0x20);
  uVar23._0_4_ = image->width;
  uVar23._4_4_ = image->height;
  image_00.data._4_4_ = iVar6;
  image_00.data._0_4_ = in_stack_ffffffffffffff80;
  image_00.width = in_stack_ffffffffffffff88;
  image_00.height = in_stack_ffffffffffffff8c;
  image_00.mipmaps = in_stack_ffffffffffffff90;
  image_00.format = in_stack_ffffffffffffff94;
  __ptr = LoadImageColors(image_00);
  bVar26 = (byte)iVar6;
  free(image->data);
  if ((image->format != 4) && (image->format != 7)) {
    TraceLog(4,"IMAGE: Format is already 16bpp or lower, dithering could have no effect");
  }
  if (((bBpp == 5) && (rBpp == 5)) && ((gBpp == 6 && (aBpp == 0)))) {
    image->format = 3;
  }
  else if ((((bBpp == 5) && (rBpp == 5)) && (gBpp == 5)) && (aBpp == 1)) {
    image->format = 5;
  }
  else if (aBpp == 4 && (bBpp == 4 && (gBpp == 4 && rBpp == 4))) {
    image->format = 6;
  }
  else {
    image->format = 0;
    TraceLog(4,"IMAGE: Unsupported dithered OpenGL internal format: %ibpp (R%iG%iB%iA%i)",
             (ulong)uVar10,(ulong)(uint)rBpp,(ulong)(uint)gBpp,(ulong)(uint)bBpp,
             CONCAT44(uVar22,aBpp),uVar23,uVar24);
  }
  cVar27 = (char)bBpp;
  iVar6 = image->width;
  iVar11 = image->height;
  pvVar7 = malloc((long)(iVar11 * iVar6) * 2);
  image->data = pvVar7;
  if (0 < iVar11) {
    bVar8 = 8 - (char)rBpp;
    bVar9 = 8 - (char)gBpp;
    iVar14 = 0;
    iVar25 = 1;
    do {
      if (0 < iVar6) {
        lVar17 = 0;
        do {
          lVar18 = iVar14 * iVar6 + lVar17;
          bVar1 = __ptr[lVar18].r;
          bVar2 = bVar1 >> (bVar8 & 0x1f);
          bVar3 = __ptr[lVar18].g >> (bVar9 & 0x1f);
          bVar4 = __ptr[lVar18].b >> (8U - cVar27 & 0x1f);
          bVar5 = __ptr[lVar18].a >> (8 - (byte)aBpp & 0x1f);
          iVar15 = (uint)__ptr[lVar18].g - ((uint)bVar3 << (bVar9 & 0x1f));
          iVar11 = (uint)__ptr[lVar18].b - ((uint)bVar4 << (8U - cVar27 & 0x1f));
          __ptr[lVar18].r = bVar2;
          __ptr[lVar18].g = bVar3;
          fVar21 = (float)(int)((uint)bVar1 - ((uint)bVar2 << (bVar8 & 0x1f)));
          __ptr[lVar18].b = bVar4;
          __ptr[lVar18].a = bVar5;
          iVar16 = (int)lVar17;
          if (iVar16 < iVar6 + -1) {
            iVar13 = (int)(fVar21 * 7.0 * 0.0625) + (uint)__ptr[lVar18 + 1].r;
            uVar12 = (uchar)iVar13;
            if (0xfe < iVar13) {
              uVar12 = 0xff;
            }
            __ptr[lVar18 + 1].r = uVar12;
            iVar13 = (int)((float)iVar15 * 7.0 * 0.0625) + (uint)__ptr[lVar18 + 1].g;
            uVar12 = (uchar)iVar13;
            if (0xfe < iVar13) {
              uVar12 = 0xff;
            }
            __ptr[lVar18 + 1].g = uVar12;
            iVar13 = (int)((float)iVar11 * 7.0 * 0.0625) + (uint)__ptr[lVar18 + 1].b;
            uVar12 = (uchar)iVar13;
            if (0xfe < iVar13) {
              uVar12 = 0xff;
            }
            __ptr[lVar18 + 1].b = uVar12;
          }
          iVar13 = image->height + -1;
          if (iVar14 < iVar13 && iVar16 != 0) {
            lVar20 = (long)(iVar25 * iVar6 + iVar16);
            iVar19 = (int)(fVar21 * 3.0 * 0.0625) + (uint)__ptr[lVar20 + -1].r;
            if (0xfe < iVar19) {
              iVar19 = 0xff;
            }
            __ptr[lVar20 + -1].r = (uchar)iVar19;
            iVar19 = (int)((float)iVar15 * 3.0 * 0.0625) + (uint)__ptr[lVar20 + -1].g;
            uVar12 = (uchar)iVar19;
            if (0xfe < iVar19) {
              uVar12 = 0xff;
            }
            __ptr[lVar20 + -1].g = uVar12;
            iVar19 = (int)((float)iVar11 * 3.0 * 0.0625) + (uint)__ptr[lVar20 + -1].b;
            uVar12 = (uchar)iVar19;
            if (0xfe < iVar19) {
              uVar12 = 0xff;
            }
            __ptr[lVar20 + -1].b = uVar12;
          }
          if (iVar14 < iVar13) {
            lVar20 = (long)(iVar6 * iVar25 + iVar16);
            iVar13 = (int)(fVar21 * 5.0 * 0.0625) + (uint)__ptr[lVar20].r;
            uVar12 = (uchar)iVar13;
            if (0xfe < iVar13) {
              uVar12 = 0xff;
            }
            iVar13 = (int)((float)iVar15 * 5.0 * 0.0625) + (uint)__ptr[lVar20].g;
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            iVar19 = (int)((float)iVar11 * 5.0 * 0.0625) + (uint)__ptr[lVar20].b;
            if (0xfe < iVar19) {
              iVar19 = 0xff;
            }
            __ptr[lVar20].r = uVar12;
            __ptr[lVar20].g = (uchar)iVar13;
            __ptr[lVar20].b = (uchar)iVar19;
            if (iVar16 < iVar6 + -1) {
              iVar6 = (int)(fVar21 * 0.0625) + (uint)__ptr[lVar20 + 1].r;
              uVar12 = (uchar)iVar6;
              if (0xfe < iVar6) {
                uVar12 = 0xff;
              }
              __ptr[lVar20 + 1].r = uVar12;
              iVar6 = (int)((float)iVar15 * 0.0625) + (uint)__ptr[lVar20 + 1].g;
              uVar12 = (uchar)iVar6;
              if (0xfe < iVar6) {
                uVar12 = 0xff;
              }
              __ptr[lVar20 + 1].g = uVar12;
              iVar6 = (int)((float)iVar11 * 0.0625) + (uint)__ptr[lVar20 + 1].b;
              uVar12 = (uchar)iVar6;
              if (0xfe < iVar6) {
                uVar12 = 0xff;
              }
              __ptr[lVar20 + 1].b = uVar12;
            }
          }
          *(ushort *)((long)image->data + lVar18 * 2) =
               (ushort)bVar4 << ((byte)aBpp & 0x1f) | (ushort)bVar5 |
               (ushort)bVar3 << (bVar26 & 0x1f) | (ushort)bVar2 << ((char)gBpp + bVar26 & 0x1f);
          iVar6 = image->width;
          lVar17 = lVar17 + 1;
        } while ((int)lVar17 < iVar6);
        iVar11 = image->height;
      }
      iVar14 = iVar14 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar14 < iVar11);
  }
  free(__ptr);
  return;
}

Assistant:

void ImageDither(Image *image, int rBpp, int gBpp, int bBpp, int aBpp)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Compressed data formats can not be dithered");
        return;
    }

    if ((rBpp + gBpp + bBpp + aBpp) > 16)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Unsupported dithering bpps (%ibpp), only 16bpp or lower modes supported", (rBpp+gBpp+bBpp+aBpp));
    }
    else
    {
        Color *pixels = LoadImageColors(*image);

        RL_FREE(image->data);      // free old image data

        if ((image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8) && (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8A8))
        {
            TRACELOG(LOG_WARNING, "IMAGE: Format is already 16bpp or lower, dithering could have no effect");
        }

        // Define new image format, check if desired bpp match internal known format
        if ((rBpp == 5) && (gBpp == 6) && (bBpp == 5) && (aBpp == 0)) image->format = PIXELFORMAT_UNCOMPRESSED_R5G6B5;
        else if ((rBpp == 5) && (gBpp == 5) && (bBpp == 5) && (aBpp == 1)) image->format = PIXELFORMAT_UNCOMPRESSED_R5G5B5A1;
        else if ((rBpp == 4) && (gBpp == 4) && (bBpp == 4) && (aBpp == 4)) image->format = PIXELFORMAT_UNCOMPRESSED_R4G4B4A4;
        else
        {
            image->format = 0;
            TRACELOG(LOG_WARNING, "IMAGE: Unsupported dithered OpenGL internal format: %ibpp (R%iG%iB%iA%i)", (rBpp+gBpp+bBpp+aBpp), rBpp, gBpp, bBpp, aBpp);
        }

        // NOTE: We will store the dithered data as unsigned short (16bpp)
        image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

        Color oldPixel = WHITE;
        Color newPixel = WHITE;

        int rError, gError, bError;
        unsigned short rPixel, gPixel, bPixel, aPixel;   // Used for 16bit pixel composition

        #define MIN(a,b) (((a)<(b))?(a):(b))

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                oldPixel = pixels[y*image->width + x];

                // NOTE: New pixel obtained by bits truncate, it would be better to round values (check ImageFormat())
                newPixel.r = oldPixel.r >> (8 - rBpp);     // R bits
                newPixel.g = oldPixel.g >> (8 - gBpp);     // G bits
                newPixel.b = oldPixel.b >> (8 - bBpp);     // B bits
                newPixel.a = oldPixel.a >> (8 - aBpp);     // A bits (not used on dithering)

                // NOTE: Error must be computed between new and old pixel but using same number of bits!
                // We want to know how much color precision we have lost...
                rError = (int)oldPixel.r - (int)(newPixel.r << (8 - rBpp));
                gError = (int)oldPixel.g - (int)(newPixel.g << (8 - gBpp));
                bError = (int)oldPixel.b - (int)(newPixel.b << (8 - bBpp));

                pixels[y*image->width + x] = newPixel;

                // NOTE: Some cases are out of the array and should be ignored
                if (x < (image->width - 1))
                {
                    pixels[y*image->width + x+1].r = MIN((int)pixels[y*image->width + x+1].r + (int)((float)rError*7.0f/16), 0xff);
                    pixels[y*image->width + x+1].g = MIN((int)pixels[y*image->width + x+1].g + (int)((float)gError*7.0f/16), 0xff);
                    pixels[y*image->width + x+1].b = MIN((int)pixels[y*image->width + x+1].b + (int)((float)bError*7.0f/16), 0xff);
                }

                if ((x > 0) && (y < (image->height - 1)))
                {
                    pixels[(y+1)*image->width + x-1].r = MIN((int)pixels[(y+1)*image->width + x-1].r + (int)((float)rError*3.0f/16), 0xff);
                    pixels[(y+1)*image->width + x-1].g = MIN((int)pixels[(y+1)*image->width + x-1].g + (int)((float)gError*3.0f/16), 0xff);
                    pixels[(y+1)*image->width + x-1].b = MIN((int)pixels[(y+1)*image->width + x-1].b + (int)((float)bError*3.0f/16), 0xff);
                }

                if (y < (image->height - 1))
                {
                    pixels[(y+1)*image->width + x].r = MIN((int)pixels[(y+1)*image->width + x].r + (int)((float)rError*5.0f/16), 0xff);
                    pixels[(y+1)*image->width + x].g = MIN((int)pixels[(y+1)*image->width + x].g + (int)((float)gError*5.0f/16), 0xff);
                    pixels[(y+1)*image->width + x].b = MIN((int)pixels[(y+1)*image->width + x].b + (int)((float)bError*5.0f/16), 0xff);
                }

                if ((x < (image->width - 1)) && (y < (image->height - 1)))
                {
                    pixels[(y+1)*image->width + x+1].r = MIN((int)pixels[(y+1)*image->width + x+1].r + (int)((float)rError*1.0f/16), 0xff);
                    pixels[(y+1)*image->width + x+1].g = MIN((int)pixels[(y+1)*image->width + x+1].g + (int)((float)gError*1.0f/16), 0xff);
                    pixels[(y+1)*image->width + x+1].b = MIN((int)pixels[(y+1)*image->width + x+1].b + (int)((float)bError*1.0f/16), 0xff);
                }

                rPixel = (unsigned short)newPixel.r;
                gPixel = (unsigned short)newPixel.g;
                bPixel = (unsigned short)newPixel.b;
                aPixel = (unsigned short)newPixel.a;

                ((unsigned short *)image->data)[y*image->width + x] = (rPixel << (gBpp + bBpp + aBpp)) | (gPixel << (bBpp + aBpp)) | (bPixel << aBpp) | aPixel;
            }
        }

        UnloadImageColors(pixels);
    }
}